

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseException.h
# Opt level: O2

string * AutoArgParse::UnexpectedArgException::makeErrorMessage
                   (string *__return_storage_ptr__,string *unexpectedArg,FlagStore *flagStore)

{
  ostream *poVar1;
  ostringstream os;
  ostringstream aoStack_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_198);
  poVar1 = std::operator<<((ostream *)aoStack_198,"Unexpected argument: ");
  poVar1 = std::operator<<(poVar1,(string *)unexpectedArg);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)aoStack_198,"Valid option(s): ");
  printUnParsed((ostringstream *)aoStack_198,&flagStore->flagInsertionOrder,&flagStore->flags);
  printUnParsed((ostringstream *)aoStack_198,&flagStore->args);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_198);
  return __return_storage_ptr__;
}

Assistant:

static std::string makeErrorMessage(const std::string& unexpectedArg,
                                        const FlagStore& flagStore) {
        std::ostringstream os;
        os << "Unexpected argument: " << unexpectedArg << std::endl;
        os << "Valid option(s): ";
        printUnParsed(os, flagStore.flagInsertionOrder, flagStore.flags);
        printUnParsed(os, flagStore.args);
        return os.str();
    }